

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc64ad.c
# Opt level: O3

int_t mc64wd_(int_t *n,int_t *ne,int_t *ip,int_t *irn,double *a,int *iperm,int_t *num,int_t *jperm,
             int_t *out,int_t *pr,int_t *q,int_t *l,double *u,double *d__)

{
  double *pdVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int_t *piVar10;
  ulong uVar11;
  double *pdVar12;
  int_t *piVar13;
  int *piVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  char *pcVar18;
  uint *pos0;
  uint uVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  char *pcVar23;
  uint uVar24;
  int iVar25;
  int_t *piVar26;
  double dVar27;
  int_t *piVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  int_t c__2;
  uint local_114;
  int_t *local_110;
  uint local_104;
  int_t *local_100;
  ulong local_f8;
  double local_f0;
  int *local_e8;
  int_t *local_e0;
  int_t local_d4;
  double local_d0;
  int_t *local_c8;
  int local_bc;
  double *local_b8;
  int_t *local_b0;
  int_t *local_a8;
  double local_a0;
  int local_94;
  double *local_90;
  long local_88;
  uint local_80;
  int local_7c;
  double *local_78;
  int_t *local_70;
  double *local_68;
  double local_60;
  long local_58;
  long local_50;
  int_t *local_48;
  uint *local_40;
  ulong local_38;
  
  local_d4 = 2;
  local_e0 = l + -1;
  local_110 = jperm + -1;
  pcVar18 = "Overflow";
  local_c8 = irn;
  local_b8 = a;
  local_b0 = ip;
  dVar29 = dmach("Overflow");
  *num = 0;
  uVar11 = (ulong)(uint)*n;
  if (0 < *n) {
    lVar8 = 0;
    do {
      *(double *)((long)u + lVar8 * 2) = dVar29;
      *(undefined8 *)((long)d__ + lVar8 * 2) = 0;
      *(undefined4 *)((long)iperm + lVar8) = 0;
      *(undefined4 *)((long)jperm + lVar8) = 0;
      *(undefined4 *)((long)pr + lVar8) = *(undefined4 *)((long)local_b0 + lVar8);
      *(undefined4 *)((long)l + lVar8) = 0;
      lVar8 = lVar8 + 4;
    } while (uVar11 << 2 != lVar8);
    uVar11 = (ulong)(uint)*n;
    ne = l;
    if (0 < *n) {
      lVar8 = 1;
      do {
        pcVar18 = (char *)(long)local_b0[lVar8];
        iVar7 = local_b0[lVar8 + -1];
        lVar22 = (long)iVar7;
        if (iVar7 < local_b0[lVar8]) {
          pcVar18 = pcVar18 + -lVar22;
          pcVar23 = (char *)0x0;
          do {
            uVar19 = local_c8[(long)(pcVar23 + lVar22 + -1)];
            ne = (int_t *)(ulong)uVar19;
            dVar27 = local_b8[(long)(pcVar23 + lVar22 + -1)];
            if (dVar27 < u[(long)(int)uVar19 + -1] || dVar27 == u[(long)(int)uVar19 + -1]) {
              u[(long)(int)uVar19 + -1] = dVar27;
              iperm[(long)(int)uVar19 + -1] = (int)lVar8;
              local_e0[(int)uVar19] = iVar7 + (int)pcVar23;
            }
            pcVar23 = pcVar23 + 1;
          } while (pcVar18 != pcVar23);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != uVar11 + 1);
      uVar11 = (ulong)(uint)*n;
      local_104 = (uint)ne;
      if (0 < *n) {
        uVar5 = 0;
        do {
          iVar7 = iperm[uVar5];
          lVar8 = (long)iVar7;
          if ((lVar8 != 0) && (iperm[uVar5] = 0, local_110[lVar8] == 0)) {
            *num = *num + 1;
            iperm[uVar5] = iVar7;
            local_110[lVar8] = l[uVar5];
          }
          uVar5 = uVar5 + 1;
        } while (uVar11 != uVar5);
        uVar11 = (ulong)(uint)*n;
      }
    }
  }
  local_100 = out + -1;
  iVar7 = *num;
  iVar15 = (int)uVar11;
  piVar13 = local_110;
  if (iVar7 != iVar15) {
    if (0 < iVar15) {
      local_a8 = local_c8 + -1;
      local_90 = local_b8 + -1;
      uVar11 = 1;
      do {
        if (local_110[uVar11] == 0) {
          iVar7 = local_b0[uVar11 - 1];
          lVar8 = (long)iVar7;
          iVar25 = local_b0[uVar11];
          dVar27 = (double)(long)iVar25;
          if (iVar7 < iVar25) {
            lVar22 = 0;
            dVar31 = dVar29;
            do {
              uVar19 = local_a8[lVar8 + lVar22];
              dVar30 = local_90[lVar8 + lVar22] - u[(long)(int)uVar19 + -1];
              if (dVar30 <= dVar31) {
                if (dVar31 <= dVar30) {
                  if (((dVar30 != dVar29) || (NAN(dVar30) || NAN(dVar29))) &&
                     ((iperm[(long)(int)uVar19 + -1] != 0 || (iperm[(long)(int)pcVar18 + -1] == 0)))
                     ) goto LAB_00113887;
                }
                ne = (int_t *)(ulong)(uint)(iVar7 + (int)lVar22);
                pcVar18 = (char *)(ulong)uVar19;
                dVar31 = dVar30;
              }
LAB_00113887:
              lVar22 = lVar22 + 1;
            } while ((long)dVar27 - lVar8 != lVar22);
            d__[uVar11 - 1] = dVar31;
            lVar8 = (long)(int)pcVar18;
            uVar5 = (ulong)ne & 0xffffffff;
            local_f0 = dVar27;
            if (iperm[lVar8 + -1] == 0) {
LAB_001139f1:
              *num = *num + 1;
              local_110[uVar11] = (int)uVar5;
              iperm[lVar8 + -1] = (int)uVar11;
              pr[uVar11 - 1] = (int)uVar5 + 1;
            }
            else if ((int)ne < iVar25) {
              uVar5 = (ulong)(int)ne;
              do {
                lVar8 = (long)local_c8[uVar5 - 1];
                if (local_b8[uVar5 - 1] - u[lVar8 + -1] <= dVar31) {
                  iVar7 = iperm[lVar8 + -1];
                  iVar20 = pr[(long)iVar7 + -1];
                  iVar2 = local_b0[iVar7];
                  if (iVar20 < iVar2) {
                    lVar22 = 0;
                    do {
                      lVar9 = (long)local_a8[iVar20 + lVar22];
                      if ((iperm[lVar9 + -1] < 1) &&
                         (local_90[iVar20 + lVar22] - u[lVar9 + -1] <= d__[(long)iVar7 + -1])) {
                        local_110[iVar7] = iVar20 + (int)lVar22;
                        iperm[lVar9 + -1] = iVar7;
                        pr[(long)iVar7 + -1] = iVar20 + 1 + (int)lVar22;
                        goto LAB_001139f1;
                      }
                      lVar22 = lVar22 + 1;
                    } while ((iVar20 - iVar2) + (int)lVar22 != 0);
                    pr[(long)iVar7 + -1] = iVar2;
                  }
                }
                uVar5 = uVar5 + 1;
              } while (iVar25 != (int)uVar5);
            }
          }
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != iVar15 + 1);
      iVar7 = *num;
      uVar11 = (ulong)(uint)*n;
    }
    iVar15 = (int)uVar11;
    local_e8 = iperm;
    if (iVar7 != iVar15) {
      bVar3 = true;
      if (iVar15 < 1) goto LAB_001142dc;
      uVar16 = (ulong)(iVar15 + 1);
      uVar5 = 0;
      do {
        d__[uVar5] = dVar29;
        l[uVar5] = 0;
        uVar5 = uVar5 + 1;
      } while (uVar11 != uVar5);
      uVar19 = *n;
      if ((int)uVar19 < 1) {
        uVar11 = (ulong)uVar19;
        goto LAB_001142dc;
      }
      lVar8 = (ulong)uVar19 + 1;
      local_70 = local_c8 + -1;
      local_78 = local_b8 + -1;
      local_48 = q + -2;
      lVar22 = 1;
      local_a0 = dVar29;
      local_50 = lVar8;
      do {
        if (piVar13[lVar22] == 0) {
          iVar7 = *n;
          uVar11 = (ulong)(iVar7 + 1U);
          pr[lVar22 + -1] = -1;
          iVar15 = local_b0[lVar22];
          iVar25 = local_b0[lVar22 + -1];
          lVar8 = (long)iVar25;
          dVar27 = dVar29;
          local_f0 = dVar29;
          piVar10 = local_e0;
          local_88 = lVar22;
          if (iVar25 < iVar15) {
            lVar9 = 0;
            uVar19 = 0;
            do {
              uVar4 = local_70[lVar8 + lVar9];
              uVar16 = (ulong)uVar4;
              dVar31 = local_78[lVar8 + lVar9] - u[(long)(int)uVar4 + -1];
              if (dVar31 < dVar27) {
                iVar20 = iVar25 + (int)lVar9;
                if (iperm[(long)(int)uVar4 + -1] == 0) {
                  local_94 = (int)lVar22;
                  dVar27 = dVar31;
                  local_bc = iVar20;
                }
                else {
                  d__[(long)(int)uVar4 + -1] = dVar31;
                  if (local_f0 <= dVar31) {
                    dVar31 = local_f0;
                  }
                  lVar21 = (long)(int)uVar19;
                  uVar19 = uVar19 + 1;
                  q[lVar21] = iVar20;
                  local_f0 = dVar31;
                }
              }
              lVar9 = lVar9 + 1;
            } while (iVar15 - lVar8 != lVar9);
            local_f8 = uVar11;
            if ((int)uVar19 < 1) goto LAB_00113d2b;
            piVar26 = (int_t *)(ulong)uVar19;
            piVar28 = (int_t *)0x0;
            uVar19 = 0;
            uVar5 = uVar11;
            local_d0 = dVar27;
            local_a8 = piVar26;
            do {
              iVar7 = q[(long)piVar28];
              uVar4 = local_c8[(long)iVar7 + -1];
              uVar16 = (ulong)uVar4;
              local_104 = uVar4;
              if (dVar27 <= d__[(long)(int)uVar4 + -1]) {
                d__[(long)(int)uVar4 + -1] = dVar29;
              }
              else {
                if (d__[(long)(int)uVar4 + -1] <= local_f0) {
                  iVar15 = (int)uVar5;
                  uVar24 = iVar15 - 1;
                  uVar5 = (ulong)uVar24;
                  q[(long)iVar15 + -2] = uVar4;
                  piVar10[(int)uVar4] = uVar24;
                }
                else {
                  uVar19 = uVar19 + 1;
                  l[(long)(int)uVar4 + -1] = uVar19;
                  mc64dd_((int_t *)&local_104,n,q,d__,l,&local_d4);
                  uVar11 = local_f8;
                  piVar10 = local_e0;
                  piVar26 = local_a8;
                  dVar29 = local_a0;
                  dVar27 = local_d0;
                }
                iVar15 = local_e8[(long)(int)uVar4 + -1];
                local_100[iVar15] = iVar7;
                pr[(long)iVar15 + -1] = (int_t)local_88;
              }
              piVar28 = (int_t *)((long)piVar28 + 1);
              piVar13 = local_110;
              iperm = local_e8;
            } while (piVar26 != piVar28);
          }
          else {
LAB_00113d2b:
            uVar5 = (ulong)(iVar7 + 1U);
            uVar19 = 0;
          }
          uVar4 = (uint)uVar5;
          iVar7 = *num;
          local_114 = uVar19;
          if (0 < iVar7) {
            uVar17 = (ulong)(int)uVar11;
            local_80 = (int)uVar11 - iVar7;
            uVar6 = 1;
            uVar11 = uVar5;
            local_7c = iVar7;
            do {
              uVar4 = (uint)uVar11;
              uVar5 = uVar11;
              local_38 = uVar6;
              if (uVar4 == (uint)uVar17) {
                piVar13 = local_110;
                if (local_114 == 0) goto LAB_00114148;
                uVar16 = (ulong)*q;
                local_f0 = d__[uVar16 - 1];
                if (dVar27 <= local_f0) goto LAB_00114148;
                piVar14 = local_48 + (int)uVar4;
                local_f8 = uVar17;
                local_d0 = dVar27;
                do {
                  uVar4 = uVar4 - 1;
                  mc64ed_((int_t *)&local_114,n,q,d__,l,&local_d4);
                  *piVar14 = (int)uVar16;
                  l[(long)(int)uVar16 + -1] = uVar4;
                  uVar17 = local_f8;
                  piVar10 = local_e0;
                  iperm = local_e8;
                  uVar5 = (ulong)uVar4;
                  dVar29 = local_a0;
                  dVar27 = local_d0;
                  if (local_114 == 0) break;
                  uVar16 = (ulong)*q;
                  piVar14 = piVar14 + -1;
                } while (d__[uVar16 - 1] <= local_f0);
              }
              piVar26 = local_70;
              uVar4 = (uint)uVar5;
              lVar8 = (long)q[uVar17 - 2];
              piVar13 = local_110;
              uVar11 = uVar17;
              if (dVar27 <= d__[lVar8 + -1]) goto LAB_00114148;
              uVar17 = uVar17 - 1;
              lVar22 = (long)iperm[lVar8 + -1];
              iVar7 = local_b0[lVar22];
              uVar19 = local_b0[lVar22 + -1];
              if ((int)uVar19 < iVar7) {
                dVar31 = (d__[lVar8 + -1] - local_b8[(long)local_110[lVar22] + -1]) + u[lVar8 + -1];
                pdVar12 = local_78 + (int)uVar19;
                local_a8 = (int_t *)(ulong)uVar19;
                lVar8 = 0;
                local_f8 = uVar17;
                local_68 = pdVar12;
                local_60 = dVar31;
                local_58 = lVar22;
                do {
                  uVar4 = piVar26[(int)uVar19 + lVar8];
                  uVar16 = (ulong)uVar4;
                  iVar15 = piVar10[(int)uVar4];
                  local_104 = uVar4;
                  if (((long)iVar15 < (long)uVar17) &&
                     (dVar30 = (pdVar12[lVar8] + dVar31) - u[(long)(int)uVar4 + -1], dVar30 < dVar27
                     )) {
                    pdVar1 = (double *)((long)local_a8 + lVar8);
                    if (local_e8[(long)(int)uVar4 + -1] == 0) {
                      local_bc = (int)pdVar1;
                      local_94 = (int)local_58;
                      dVar27 = dVar30;
                    }
                    else {
                      local_90 = pdVar1;
                      if ((dVar30 < d__[(long)(int)uVar4 + -1]) &&
                         (iVar25 = (int)uVar5, iVar15 < iVar25)) {
                        pos0 = (uint *)(piVar10 + (int)uVar4);
                        d__[(long)(int)uVar4 + -1] = dVar30;
                        if (dVar30 <= local_f0) {
                          if (iVar15 != 0) {
                            local_d0 = dVar27;
                            local_40 = pos0;
                            mc64fd_((int_t *)pos0,(int_t *)&local_114,n,q,d__,l,&local_d4);
                            piVar10 = local_e0;
                            pdVar12 = local_68;
                            uVar17 = local_f8;
                            pos0 = local_40;
                            dVar29 = local_a0;
                            dVar27 = local_d0;
                            dVar31 = local_60;
                          }
                          uVar5 = (ulong)(iVar25 - 1U);
                          q[(long)iVar25 + -2] = uVar4;
                          *pos0 = iVar25 - 1U;
                        }
                        else {
                          if (iVar15 == 0) {
                            local_114 = local_114 + 1;
                            *pos0 = local_114;
                          }
                          local_d0 = dVar27;
                          mc64dd_((int_t *)&local_104,n,q,d__,l,&local_d4);
                          pdVar12 = local_68;
                          uVar17 = local_f8;
                          piVar10 = local_e0;
                          dVar29 = local_a0;
                          dVar27 = local_d0;
                          dVar31 = local_60;
                        }
                        iVar15 = local_e8[(long)(int)uVar4 + -1];
                        local_100[iVar15] = (int_t)local_90;
                        pr[(long)iVar15 + -1] = (int_t)local_58;
                      }
                    }
                  }
                  lVar8 = lVar8 + 1;
                } while ((uVar19 - iVar7) + (int)lVar8 != 0);
              }
              uVar4 = (uint)uVar5;
              uVar6 = (ulong)((int)local_38 + 1);
              iperm = local_e8;
              uVar11 = uVar5;
            } while ((int)local_38 != local_7c);
            uVar11 = (ulong)local_80;
            piVar13 = local_110;
          }
LAB_00114148:
          if ((dVar27 != dVar29) || (NAN(dVar27) || NAN(dVar29))) {
            *num = *num + 1;
            uVar16 = (ulong)local_c8[(long)local_bc + -1];
            iperm[uVar16 - 1] = local_94;
            lVar8 = (long)local_94;
            piVar13[lVar8] = local_bc;
            iVar7 = *num;
            if (0 < iVar7) {
              do {
                iVar15 = pr[lVar8 + -1];
                if (iVar15 == -1) break;
                iVar25 = local_100[lVar8];
                uVar16 = (ulong)local_c8[(long)iVar25 + -1];
                iperm[uVar16 - 1] = iVar15;
                lVar8 = (long)iVar15;
                piVar13[lVar8] = iVar25;
                iVar7 = iVar7 + -1;
              } while (iVar7 != 0);
            }
            iVar7 = *n;
            iVar15 = (int)uVar11;
            if (iVar15 <= iVar7) {
              lVar8 = -1;
              do {
                uVar16 = (ulong)q[iVar15 + lVar8];
                u[uVar16 - 1] = (u[uVar16 - 1] + d__[uVar16 - 1]) - dVar27;
                lVar8 = lVar8 + 1;
              } while (iVar7 - iVar15 != (int)lVar8);
            }
          }
          else {
            iVar7 = *n;
          }
          if ((int)uVar4 <= iVar7) {
            lVar8 = -1;
            do {
              uVar16 = (ulong)q[(int)uVar4 + lVar8];
              d__[uVar16 - 1] = dVar29;
              piVar10[uVar16] = 0;
              lVar8 = lVar8 + 1;
            } while (iVar7 - uVar4 != (int)lVar8);
          }
          if (0 < (int)local_114) {
            uVar11 = 0;
            do {
              uVar16 = (ulong)q[uVar11];
              d__[uVar16 - 1] = dVar29;
              piVar10[uVar16] = 0;
              uVar11 = uVar11 + 1;
            } while (local_114 != uVar11);
          }
          local_104 = (uint)uVar16;
          lVar8 = local_50;
          lVar22 = local_88;
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != lVar8);
      uVar11 = (ulong)(uint)*n;
    }
  }
  bVar3 = (int)uVar11 < 1;
  if ((int)uVar11 < 1) {
    bVar3 = true;
  }
  else {
    uVar5 = 0;
    do {
      lVar8 = (long)jperm[uVar5];
      if (lVar8 == 0) {
        dVar29 = 0.0;
      }
      else {
        dVar29 = local_b8[lVar8 + -1] - u[(long)local_c8[lVar8 + -1] + -1];
      }
      d__[uVar5] = dVar29;
      if (iperm[uVar5] == 0) {
        u[uVar5] = 0.0;
      }
      uVar5 = uVar5 + 1;
    } while (uVar11 != uVar5);
  }
LAB_001142dc:
  iVar7 = (int)uVar11;
  if (*num != iVar7) {
    if (!bVar3) {
      memset(jperm,0,uVar11 << 2);
      iVar7 = *n;
    }
    if (0 < iVar7) {
      iVar15 = 0;
      uVar11 = 1;
      do {
        iVar20 = iVar15 + 1;
        iVar25 = iperm[uVar11 - 1];
        piVar10 = piVar13;
        if (iperm[uVar11 - 1] == 0) {
          iVar15 = iVar20;
          iVar25 = iVar20;
          piVar10 = local_100;
        }
        piVar10[iVar25] = (int_t)uVar11;
        uVar11 = uVar11 + 1;
      } while (iVar7 + 1 != uVar11);
      uVar19 = *n;
      if (0 < (int)uVar19) {
        iVar7 = 0;
        lVar8 = 1;
        do {
          if (jperm[lVar8 + -1] == 0) {
            lVar22 = (long)iVar7;
            iVar7 = iVar7 + 1;
            iperm[(long)local_100[lVar22 + 1] + -1] = (int)lVar8;
          }
          lVar8 = lVar8 + 1;
        } while ((ulong)uVar19 + 1 != lVar8);
      }
    }
  }
  return 0;
}

Assistant:

int_t mc64wd_(int_t *n, int_t *ne, int_t *ip, int_t *
	irn, double *a, int *iperm, int_t *num, int_t *jperm, 
	int_t *out, int_t *pr, int_t *q, int_t *l, double *u, 
	double *d__)
{
    /* System generated locals */
    int_t i__1, i__2, i__3, c__2 = 2;

    /* Local variables */
    int_t i__, j, k, i0, k0, k1, k2, q0;
    double di;
    int_t ii, jj, kk;
    double vj;
    int_t up;
    double dq0;
    int_t kk1, kk2;
    double csp;
    int_t isp, jsp, low;
    double dmin__, dnew;
    int_t jord, qlen, jdum;
    double rinf;
    extern /* Subroutine */ int_t
	mc64dd_(int_t *, int_t *, int_t *, double *, int_t *, int_t *),
	mc64ed_(int_t *, int_t *, int_t *, double *, int_t *, int_t *),
	mc64fd_(int_t *, int_t *, int_t *, int_t *, double *, int_t *, int_t *);


/* *** Copyright (c) 1999  Council for the Central Laboratory of the */
/*     Research Councils                                             *** */
/* *** Although every effort has been made to ensure robustness and  *** */
/* *** reliability of the subroutines in this MC64 suite, we         *** */
/* *** disclaim any liability arising through the use or misuse of   *** */
/* *** any of the subroutines.                                       *** */
/* *** Any problems?   Contact ... */
/*     Iain Duff (I.Duff@rl.ac.uk) or Jacko Koster (jak@ii.uib.no)   *** */

/* N, NE, IP, IRN are described in MC64A/AD. */
/* A is a REAL (DOUBLE PRECISION in the D-version) array of length NE. */
/*   A(K), K=1..NE, must be set to the value of the entry that */
/*   corresponds to IRN(K). It is not altered. */
/*   All values A(K) must be non-negative. */
/* IPERM is an INT_T array of length N. On exit, it contains the */
/*   weighted matching: IPERM(I) = 0 or row I is matched to column */
/*   IPERM(I). */
/* NUM is an INT_T variable. On exit, it contains the cardinality of */
/*   the matching stored in IPERM. */
/* IW is an INT_T work array of length 5N. */
/* DW is a REAL (DOUBLE PRECISION in the D-version) array of length 2N. */
/*   On exit, U = D(1:N) contains the dual row variable and */
/*   V = D(N+1:2N) contains the dual column variable. If the matrix */
/*   is structurally nonsingular (NUM = N), the following holds: */
/*      U(I)+V(J) <= A(I,J)  if IPERM(I) |= J */
/*      U(I)+V(J)  = A(I,J)  if IPERM(I)  = J */
/*      U(I) = 0  if IPERM(I) = 0 */
/*      V(J) = 0  if there is no I for which IPERM(I) = J */
/* Local variables */
/* Local parameters */
/* External subroutines and/or functions */
/*      EXTERNAL FD05AD,MC64DD,MC64ED,MC64FD */
/*      DOUBLE PRECISION FD05AD */
/* Set RINF to largest positive real number */
/* XSL      RINF = FD05AD(5) */
    /* Parameter adjustments */
    --d__;
    --u;
    --l;
    --q;
    --pr;
    --out;
    --jperm;
    --iperm;
    --ip;
    --a;
    --irn;

    /* Function Body */
    rinf = dmach("Overflow");
/* Initialization */
    *num = 0;
    i__1 = *n;
    for (k = 1; k <= i__1; ++k) {
	u[k] = rinf;
	d__[k] = 0.;
	iperm[k] = 0;
	jperm[k] = 0;
	pr[k] = ip[k];
	l[k] = 0;
/* L10: */
    }
/* Initialize U(I) */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	i__2 = ip[j + 1] - 1;
	for (k = ip[j]; k <= i__2; ++k) {
	    i__ = irn[k];
	    if (a[k] > u[i__]) {
		goto L20;
	    }
	    u[i__] = a[k];
	    iperm[i__] = j;
	    l[i__] = k;
L20:
	    ;
	}
/* L30: */
    }
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	j = iperm[i__];
	if (j == 0) {
	    goto L40;
	}
/* Row I is not empty */
	iperm[i__] = 0;
	if (jperm[j] != 0) {
	    goto L40;
	}
/* Assignment of column J to row I */
	++(*num);
	iperm[i__] = j;
	jperm[j] = l[i__];
L40:
	;
    }
    if (*num == *n) {
	goto L1000;
    }
/* Scan unassigned columns; improve assignment */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/* JPERM(J) ne 0 iff column J is already assigned */
	if (jperm[j] != 0) {
	    goto L95;
	}
	k1 = ip[j];
	k2 = ip[j + 1] - 1;
/* Continue only if column J is not empty */
	if (k1 > k2) {
	    goto L95;
	}
	vj = rinf;
	i__2 = k2;
	for (k = k1; k <= i__2; ++k) {
	    i__ = irn[k];
	    di = a[k] - u[i__];
	    if (di > vj) {
		goto L50;
	    }
	    if (di < vj || di == rinf) {
		goto L55;
	    }
	    if (iperm[i__] != 0 || iperm[i0] == 0) {
		goto L50;
	    }
L55:
	    vj = di;
	    i0 = i__;
	    k0 = k;
L50:
	    ;
	}
	d__[j] = vj;
	k = k0;
	i__ = i0;
	if (iperm[i__] == 0) {
	    goto L90;
	}
	i__2 = k2;
	for (k = k0; k <= i__2; ++k) {
	    i__ = irn[k];
	    if (a[k] - u[i__] > vj) {
		goto L60;
	    }
	    jj = iperm[i__];
/* Scan remaining part of assigned column JJ */
	    kk1 = pr[jj];
	    kk2 = ip[jj + 1] - 1;
	    if (kk1 > kk2) {
		goto L60;
	    }
	    i__3 = kk2;
	    for (kk = kk1; kk <= i__3; ++kk) {
		ii = irn[kk];
		if (iperm[ii] > 0) {
		    goto L70;
		}
		if (a[kk] - u[ii] <= d__[jj]) {
		    goto L80;
		}
L70:
		;
	    }
	    pr[jj] = kk2 + 1;
L60:
	    ;
	}
	goto L95;
L80:
	jperm[jj] = kk;
	iperm[ii] = jj;
	pr[jj] = kk + 1;
L90:
	++(*num);
	jperm[j] = k;
	iperm[i__] = j;
	pr[j] = k + 1;
L95:
	;
    }
    if (*num == *n) {
	goto L1000;
    }
/* Prepare for main loop */
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	d__[i__] = rinf;
	l[i__] = 0;
/* L99: */
    }
/* Main loop ... each pass round this loop is similar to Dijkstra's */
/* algorithm for solving the single source shortest path problem */
    i__1 = *n;
    for (jord = 1; jord <= i__1; ++jord) {
	if (jperm[jord] != 0) {
	    goto L100;
	}
/* JORD is next unmatched column */
/* DMIN is the length of shortest path in the tree */
	dmin__ = rinf;
	qlen = 0;
	low = *n + 1;
	up = *n + 1;
/* CSP is the cost of the shortest augmenting path to unassigned row */
/* IRN(ISP). The corresponding column index is JSP. */
	csp = rinf;
/* Build shortest path tree starting from unassigned column (root) JORD */
	j = jord;
	pr[j] = -1;
/* Scan column J */
	i__2 = ip[j + 1] - 1;
	for (k = ip[j]; k <= i__2; ++k) {
	    i__ = irn[k];
	    dnew = a[k] - u[i__];
	    if (dnew >= csp) {
		goto L115;
	    }
	    if (iperm[i__] == 0) {
		csp = dnew;
		isp = k;
		jsp = j;
	    } else {
		if (dnew < dmin__) {
		    dmin__ = dnew;
		}
		d__[i__] = dnew;
		++qlen;
		q[qlen] = k;
	    }
L115:
	    ;
	}
/* Initialize heap Q and Q2 with rows held in Q(1:QLEN) */
	q0 = qlen;
	qlen = 0;
	i__2 = q0;
	for (kk = 1; kk <= i__2; ++kk) {
	    k = q[kk];
	    i__ = irn[k];
	    if (csp <= d__[i__]) {
		d__[i__] = rinf;
		goto L120;
	    }
	    if (d__[i__] <= dmin__) {
		--low;
		q[low] = i__;
		l[i__] = low;
	    } else {
		++qlen;
		l[i__] = qlen;
		mc64dd_(&i__, n, &q[1], &d__[1], &l[1], &c__2);
	    }
/* Update tree */
	    jj = iperm[i__];
	    out[jj] = k;
	    pr[jj] = j;
L120:
	    ;
	}
	i__2 = *num;
	for (jdum = 1; jdum <= i__2; ++jdum) {
/* If Q2 is empty, extract rows from Q */
	    if (low == up) {
		if (qlen == 0) {
		    goto L160;
		}
		i__ = q[1];
		if (d__[i__] >= csp) {
		    goto L160;
		}
		dmin__ = d__[i__];
L152:
		mc64ed_(&qlen, n, &q[1], &d__[1], &l[1], &c__2);
		--low;
		q[low] = i__;
		l[i__] = low;
		if (qlen == 0) {
		    goto L153;
		}
		i__ = q[1];
		if (d__[i__] > dmin__) {
		    goto L153;
		}
		goto L152;
	    }
/* Q0 is row whose distance D(Q0) to the root is smallest */
L153:
	    q0 = q[up - 1];
	    dq0 = d__[q0];
/* Exit loop if path to Q0 is longer than the shortest augmenting path */
	    if (dq0 >= csp) {
		goto L160;
	    }
	    --up;
/* Scan column that matches with row Q0 */
	    j = iperm[q0];
	    vj = dq0 - a[jperm[j]] + u[q0];
	    i__3 = ip[j + 1] - 1;
	    for (k = ip[j]; k <= i__3; ++k) {
		i__ = irn[k];
		if (l[i__] >= up) {
		    goto L155;
		}
/* DNEW is new cost */
		dnew = vj + a[k] - u[i__];
/* Do not update D(I) if DNEW ge cost of shortest path */
		if (dnew >= csp) {
		    goto L155;
		}
		if (iperm[i__] == 0) {
/* Row I is unmatched; update shortest path info */
		    csp = dnew;
		    isp = k;
		    jsp = j;
		} else {
/* Row I is matched; do not update D(I) if DNEW is larger */
		    di = d__[i__];
		    if (di <= dnew) {
			goto L155;
		    }
		    if (l[i__] >= low) {
			goto L155;
		    }
		    d__[i__] = dnew;
		    if (dnew <= dmin__) {
			if (l[i__] != 0) {
			    mc64fd_(&l[i__], &qlen, n, &q[1], &d__[1], &l[1], 
				    &c__2);
			}
			--low;
			q[low] = i__;
			l[i__] = low;
		    } else {
			if (l[i__] == 0) {
			    ++qlen;
			    l[i__] = qlen;
			}
			mc64dd_(&i__, n, &q[1], &d__[1], &l[1], &c__2);
		    }
/* Update tree */
		    jj = iperm[i__];
		    out[jj] = k;
		    pr[jj] = j;
		}
L155:
		;
	    }
/* L150: */
	}
/* If CSP = RINF, no augmenting path is found */
L160:
	if (csp == rinf) {
	    goto L190;
	}
/* Find augmenting path by tracing backward in PR; update IPERM,JPERM */
	++(*num);
	i__ = irn[isp];
	iperm[i__] = jsp;
	jperm[jsp] = isp;
	j = jsp;
	i__2 = *num;
	for (jdum = 1; jdum <= i__2; ++jdum) {
	    jj = pr[j];
	    if (jj == -1) {
		goto L180;
	    }
	    k = out[j];
	    i__ = irn[k];
	    iperm[i__] = jj;
	    jperm[jj] = k;
	    j = jj;
/* L170: */
	}
/* End of dummy loop; this point is never reached */
/* Update U for rows in Q(UP:N) */
L180:
	i__2 = *n;
	for (kk = up; kk <= i__2; ++kk) {
	    i__ = q[kk];
	    u[i__] = u[i__] + d__[i__] - csp;
/* L185: */
	}
L190:
	i__2 = *n;
	for (kk = low; kk <= i__2; ++kk) {
	    i__ = q[kk];
	    d__[i__] = rinf;
	    l[i__] = 0;
/* L191: */
	}
	i__2 = qlen;
	for (kk = 1; kk <= i__2; ++kk) {
	    i__ = q[kk];
	    d__[i__] = rinf;
	    l[i__] = 0;
/* L193: */
	}
L100:
	;
    }
/* End of main loop */
/* Set dual column variable in D(1:N) */
L1000:
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	k = jperm[j];
	if (k != 0) {
	    d__[j] = a[k] - u[irn[k]];
	} else {
	    d__[j] = 0.;
	}
	if (iperm[j] == 0) {
	    u[j] = 0.;
	}
/* L200: */
    }
    if (*num == *n) {
	goto L1100;
    }
/* The matrix is structurally singular, complete IPERM. */
/* JPERM, OUT are work arrays */
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	jperm[j] = 0;
/* L300: */
    }
    k = 0;
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	if (iperm[i__] == 0) {
	    ++k;
	    out[k] = i__;
	} else {
	    j = iperm[i__];
	    jperm[j] = i__;
	}
/* L310: */
    }
    k = 0;
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	if (jperm[j] != 0) {
	    goto L320;
	}
	++k;
	jdum = out[k];
	iperm[jdum] = j;
L320:
	;
    }
L1100:
    return 0;
}